

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

void Prs_CreateVerilogPio(Cba_Ntk_t *p,Prs_Ntk_t *pNtk)

{
  uint uVar1;
  uint f;
  Cba_Man_t *pCVar2;
  uint i;
  int iVar3;
  int *piVar4;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  int Fill_03;
  long lVar5;
  
  uVar1 = (p->vObjType).nCap;
  if ((p->vObjFunc).nCap < (int)uVar1) {
    piVar4 = (p->vObjFunc).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
    }
    (p->vObjFunc).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_003e5347;
    (p->vObjFunc).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vObjFunc).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vObjFunc).nSize = uVar1;
  uVar1 = (p->vObjType).nCap;
  if ((p->vObjName).nCap < (int)uVar1) {
    piVar4 = (p->vObjName).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
    }
    (p->vObjName).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_003e5347;
    (p->vObjName).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vObjName).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vObjName).nSize = uVar1;
  uVar1 = (p->vFonObj).nCap;
  if ((p->vFonName).nCap < (int)uVar1) {
    piVar4 = (p->vFonName).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
    }
    (p->vFonName).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_003e5347;
    (p->vFonName).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vFonName).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vFonName).nSize = uVar1;
  uVar1 = (p->vFonObj).nCap;
  if ((p->vFonRange).nCap < (int)uVar1) {
    piVar4 = (p->vFonRange).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
    }
    (p->vFonRange).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
LAB_003e5347:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vFonRange).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vFonRange).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vFonRange).nSize = uVar1;
  pCVar2 = p->pDesign;
  if (0 < (pCVar2->vUsed).nSize) {
    piVar4 = (pCVar2->vUsed).pArray;
    lVar5 = 0;
    do {
      iVar3 = piVar4[lVar5];
      if (((long)iVar3 < 0) || ((pCVar2->vNameMap).nSize <= iVar3)) goto LAB_003e52ac;
      (pCVar2->vNameMap).pArray[iVar3] = 0;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pCVar2->vUsed).nSize);
  }
  (pCVar2->vUsed).nSize = 0;
  if ((pNtk->vInouts).nSize != 0) {
    __assert_fail("Vec_IntSize(&pNtk->vInouts) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x6fd,"void Prs_CreateVerilogPio(Cba_Ntk_t *, Prs_Ntk_t *)");
  }
  if (0 < (pNtk->vInputs).nSize) {
    lVar5 = 0;
    do {
      if ((pNtk->vInputsR).nSize <= lVar5) goto LAB_003e528d;
      uVar1 = (pNtk->vInputs).pArray[lVar5];
      iVar3 = (pNtk->vInputsR).pArray[lVar5];
      i = Cba_ObjAlloc(p,CBA_OBJ_PI,0,1);
      Cba_ObjSetName(p,i,uVar1);
      if ((int)i < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if ((p->vObjFon0).nSize <= (int)i) goto LAB_003e528d;
      if ((p->vFonRange).nSize < 1) {
        __assert_fail("Cba_NtkHasFonRanges(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0x118,"void Cba_FonSetRangeSign(Cba_Ntk_t *, int, int)");
      }
      f = (p->vObjFon0).pArray[i];
      Vec_IntFillExtra(&p->vFonRange,f + 1,Fill);
      if (((int)f < 0) || ((p->vFonRange).nSize <= (int)f)) goto LAB_003e52ac;
      (p->vFonRange).pArray[f] = iVar3;
      Cba_FonSetName(p,f,uVar1);
      pCVar2 = p->pDesign;
      Vec_IntFillExtra(&pCVar2->vNameMap,uVar1 + 1,Fill_00);
      if (((int)uVar1 < 0) || ((pCVar2->vNameMap).nSize <= (int)uVar1)) goto LAB_003e528d;
      if ((pCVar2->vNameMap).pArray[uVar1] != 0) goto LAB_003e52cb;
      Vec_IntFillExtra(&pCVar2->vNameMap,uVar1 + 1,Fill_01);
      if ((pCVar2->vNameMap).nSize <= (int)uVar1) goto LAB_003e52ac;
      (pCVar2->vNameMap).pArray[uVar1] = i;
      Vec_IntPush(&pCVar2->vUsed,uVar1);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pNtk->vInputs).nSize);
  }
  if (0 < (pNtk->vOutputs).nSize) {
    lVar5 = 0;
    do {
      if ((pNtk->vOutputsR).nSize <= lVar5) {
LAB_003e528d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = (pNtk->vOutputs).pArray[lVar5];
      iVar3 = Cba_ObjAlloc(p,CBA_OBJ_PO,1,0);
      Cba_ObjSetName(p,iVar3,uVar1);
      pCVar2 = p->pDesign;
      Vec_IntFillExtra(&pCVar2->vNameMap,uVar1 + 1,Fill_02);
      if (((int)uVar1 < 0) || ((pCVar2->vNameMap).nSize <= (int)uVar1)) goto LAB_003e528d;
      if ((pCVar2->vNameMap).pArray[uVar1] != 0) {
LAB_003e52cb:
        __assert_fail("Vec_IntGetEntry(&p->vNameMap, i) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0x30e,"void Cba_ManSetMap(Cba_Man_t *, int, int)");
      }
      Vec_IntFillExtra(&pCVar2->vNameMap,uVar1 + 1,Fill_03);
      if ((pCVar2->vNameMap).nSize <= (int)uVar1) {
LAB_003e52ac:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pCVar2->vNameMap).pArray[uVar1] = iVar3;
      Vec_IntPush(&pCVar2->vUsed,uVar1);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pNtk->vOutputs).nSize);
  }
  if (0 < (pNtk->vOrder).nSize) {
    lVar5 = 0;
    do {
      uVar1 = (pNtk->vOrder).pArray[lVar5];
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x13d,"int Abc_Lit2Var2(int)");
      }
      iVar3 = Prs_CreateVerilogFindFon(p,uVar1 >> 2);
      if (iVar3 != 0) {
        Vec_IntPush(&p->vOrder,iVar3);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pNtk->vOrder).nSize);
  }
  return;
}

Assistant:

void Prs_CreateVerilogPio( Cba_Ntk_t * p, Prs_Ntk_t * pNtk )
{
    int i, NameId, RangeId, iObj, iFon;
    Cba_NtkCleanObjFuncs( p );
    Cba_NtkCleanObjNames( p );
    Cba_NtkCleanFonNames( p );
    Cba_NtkCleanFonRanges( p );
    // create inputs
    Cba_NtkCleanMap( p );
    assert( Vec_IntSize(&pNtk->vInouts) == 0 );
    Vec_IntForEachEntryTwo( &pNtk->vInputs, &pNtk->vInputsR, NameId, RangeId, i )
    {
        iObj = Cba_ObjAlloc( p, CBA_OBJ_PI, 0, 1 );
        Cba_ObjSetName( p, iObj, NameId ); // direct name
        iFon = Cba_ObjFon0(p, iObj);
        Cba_FonSetRangeSign( p, iFon, RangeId );
        Cba_FonSetName( p, iFon, NameId );
        Cba_NtkSetMap( p, NameId, iObj );
    }
    // create outputs
    Vec_IntForEachEntryTwo( &pNtk->vOutputs, &pNtk->vOutputsR, NameId, RangeId, i )
    {
        iObj = Cba_ObjAlloc( p, CBA_OBJ_PO, 1, 0 );
        Cba_ObjSetName( p, iObj, NameId ); // direct name
        Cba_NtkSetMap( p, NameId, iObj );
    }
    // create order
    Vec_IntForEachEntry( &pNtk->vOrder, NameId, i )
    {
        iObj = Prs_CreateVerilogFindFon( p, Abc_Lit2Var2(NameId) ); // labeled name
        if ( iObj )
            Vec_IntPush( &p->vOrder, iObj );
    }
}